

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildWithQueryDepsLogTest::SetUp(BuildWithQueryDepsLogTest *this)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  string err;
  allocator<char> local_31;
  string local_30;
  BuildWithQueryDepsLogTest *local_10;
  BuildWithQueryDepsLogTest *this_local;
  
  local_10 = this;
  BuildTest::SetUp(&this->super_BuildTest);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"BuildWithQueryDepsLogTest",&local_31);
  ScopedTempDir::CreateAndEnter(&this->temp_dir_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::string((string *)local_68);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"ninja_deps",&local_89);
  bVar2 = DepsLog::OpenForWrite(&this->log_,&local_88,(string *)local_68);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x863,"log_.OpenForWrite(\"ninja_deps\", &err)");
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  pTVar1 = g_current_test;
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_68);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x864,"\"\" == err");
    if (!bVar2) {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

virtual void SetUp() {
    BuildTest::SetUp();

    temp_dir_.CreateAndEnter("BuildWithQueryDepsLogTest");

    std::string err;
    ASSERT_TRUE(log_.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);
  }